

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlistview.cpp
# Opt level: O3

QModelIndex * __thiscall
QListView::moveCursor
          (QModelIndex *__return_storage_ptr__,QListView *this,CursorAction cursorAction,
          KeyboardModifiers modifiers)

{
  QPersistentModelIndex *pQVar1;
  Flow FVar2;
  QListViewPrivate *this_00;
  QSize QVar3;
  QWidgetData *pQVar4;
  Representation RVar5;
  QArrayData *pQVar6;
  bool bVar7;
  int iVar8;
  int iVar9;
  LayoutDirection LVar10;
  long lVar12;
  Representation RVar13;
  undefined8 uVar14;
  uint uVar15;
  int iVar16;
  QAbstractItemModel *pQVar17;
  QCommonListViewBase *pQVar18;
  Representation RVar19;
  QModelIndex *index;
  long in_FS_OFFSET;
  undefined4 uVar20;
  undefined4 uVar21;
  QRect QVar22;
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  QRect QVar26;
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 local_e8 [8];
  undefined1 *puStack_e0;
  totally_ordered_wrapper<const_QAbstractItemModel_*> local_d8;
  QArrayData *local_c8;
  undefined1 *puStack_c0;
  totally_ordered_wrapper<const_QAbstractItemModel_*> local_b8;
  undefined8 local_a8;
  Representation local_a0;
  Representation RStack_9c;
  QRect local_98;
  undefined8 local_88;
  undefined8 uStack_80;
  totally_ordered_wrapper<const_QAbstractItemModel_*> local_78;
  QArrayData *local_68;
  undefined1 *puStack_60;
  totally_ordered_wrapper<const_QAbstractItemModel_*> local_58;
  undefined1 local_48 [16];
  long local_38;
  ulong uVar11;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = *(QListViewPrivate **)
             &(this->super_QAbstractItemView).super_QAbstractScrollArea.super_QFrame.super_QWidget.
              field_0x8;
  local_78.ptr = (QAbstractItemModel *)&DAT_aaaaaaaaaaaaaaaa;
  local_88 = (QArrayData *)&DAT_aaaaaaaaaaaaaaaa;
  uStack_80 = (QModelIndex *)&DAT_aaaaaaaaaaaaaaaa;
  QAbstractItemView::currentIndex((QModelIndex *)&local_88,(QAbstractItemView *)this);
  iVar8 = (int)local_88;
  if ((((int)local_88 < 0) || ((long)local_88 < 0)) || (local_78.ptr == (QAbstractItemModel *)0x0))
  {
    pQVar17 = (this_00->super_QAbstractItemViewPrivate).model;
    pQVar1 = &(this_00->super_QAbstractItemViewPrivate).root;
    QPersistentModelIndex::operator_cast_to_QModelIndex((QModelIndex *)&local_68,pQVar1);
    iVar8 = (**(code **)(*(long *)pQVar17 + 0x78))(pQVar17,(QModelIndex *)&local_68);
    if (0 < iVar8) {
      iVar16 = 0;
      do {
        bVar7 = QListViewPrivate::isHiddenOrDisabled(this_00,iVar16);
        if (!bVar7) {
          pQVar17 = (this_00->super_QAbstractItemViewPrivate).model;
          iVar8 = this_00->column;
          QPersistentModelIndex::operator_cast_to_QModelIndex((QModelIndex *)&local_68,pQVar1);
          lVar12 = *(long *)pQVar17;
          goto LAB_0056bc12;
        }
        iVar16 = iVar16 + 1;
      } while (iVar8 != iVar16);
    }
    __return_storage_ptr__->r = -1;
    __return_storage_ptr__->c = -1;
    __return_storage_ptr__->i = 0;
    (__return_storage_ptr__->m).ptr = (QAbstractItemModel *)0x0;
    goto LAB_0056bec3;
  }
  FVar2 = this_00->flow;
  if (cursorAction == MoveLeft && FVar2 == LeftToRight) {
switchD_0056bb2f_caseD_0:
    uVar11 = local_a8;
    QVar22 = local_98;
    if ((int)local_88 != 0) {
      uVar15 = (int)local_88 + 1;
      do {
        iVar16 = uVar15 - 2;
        bVar7 = QListViewPrivate::isHiddenOrDisabled(this_00,iVar16);
        if (!bVar7) {
          pQVar17 = (this_00->super_QAbstractItemViewPrivate).model;
          iVar8 = this_00->column;
          QPersistentModelIndex::operator_cast_to_QModelIndex
                    ((QModelIndex *)&local_68,&(this_00->super_QAbstractItemViewPrivate).root);
          lVar12 = *(long *)pQVar17;
          goto LAB_0056bc12;
        }
        uVar15 = uVar15 - 1;
        uVar11 = local_a8;
        QVar22 = local_98;
      } while (1 < uVar15);
    }
switchD_0056bd27_default:
    local_98 = QVar22;
    local_a8 = uVar11;
    (__return_storage_ptr__->m).ptr = local_78.ptr;
    *(QArrayData **)__return_storage_ptr__ = local_88;
    __return_storage_ptr__->i = (quintptr)uStack_80;
    goto LAB_0056bec3;
  }
  if (FVar2 != TopToBottom) {
    if (cursorAction != MoveRight || FVar2 != LeftToRight) goto switchD_0056bb2f_caseD_2;
switchD_0056bb2f_caseD_1:
    iVar16 = (int)local_88 + 1;
    pQVar17 = (this_00->super_QAbstractItemViewPrivate).model;
    pQVar1 = &(this_00->super_QAbstractItemViewPrivate).root;
    QPersistentModelIndex::operator_cast_to_QModelIndex((QModelIndex *)&local_68,pQVar1);
    iVar9 = (**(code **)(*(long *)pQVar17 + 0x78))(pQVar17,(QModelIndex *)&local_68);
    uVar11 = local_a8;
    QVar22 = local_98;
    if (iVar16 < iVar9) {
      do {
        iVar16 = iVar8 + 1;
        bVar7 = QListViewPrivate::isHiddenOrDisabled(this_00,iVar16);
        uVar11 = local_a8;
        QVar22 = local_98;
        if (!bVar7) {
          if (iVar8 != -2) {
            pQVar17 = (this_00->super_QAbstractItemViewPrivate).model;
            iVar8 = this_00->column;
            QPersistentModelIndex::operator_cast_to_QModelIndex((QModelIndex *)&local_68,pQVar1);
            lVar12 = *(long *)pQVar17;
            goto LAB_0056bc12;
          }
          break;
        }
        iVar8 = iVar16;
      } while (iVar9 + -1 != iVar16);
    }
    goto switchD_0056bd27_default;
  }
  switch(cursorAction) {
  case MoveUp:
  case MovePrevious:
    goto switchD_0056bb2f_caseD_0;
  case MoveDown:
  case MoveNext:
    goto switchD_0056bb2f_caseD_1;
  default:
switchD_0056bb2f_caseD_2:
    index = (QModelIndex *)&local_88;
    QVar22 = QListViewPrivate::rectForIndex
                       (*(QListViewPrivate **)
                         &(this->super_QAbstractItemView).super_QAbstractScrollArea.super_QFrame.
                          super_QWidget.field_0x8,index);
    local_98 = QVar22;
    QVar22 = local_98;
    local_98._0_8_ = QVar22._0_8_;
    local_a8._0_4_ = local_98.x1.m_i;
    local_a8._4_4_ = local_98.y1.m_i;
    uVar11 = local_a8;
    local_98._8_8_ = QVar22._8_8_;
    local_a0.m_i = local_98.x2.m_i;
    RStack_9c.m_i = local_98.y2.m_i;
    uVar14 = _local_a0;
    local_a8._0_4_ = QVar22.x1.m_i;
    local_a8._4_4_ = QVar22.y1.m_i;
    local_a0 = QVar22.x2.m_i;
    RStack_9c = QVar22.y2.m_i;
    local_a8 = uVar11;
    _local_a0 = uVar14;
    local_98 = QVar22;
    if (RStack_9c.m_i < local_a8._4_4_ || local_a0.m_i < local_a8._0_4_) {
      pQVar17 = (this_00->super_QAbstractItemViewPrivate).model;
      iVar8 = this_00->column;
      QPersistentModelIndex::operator_cast_to_QModelIndex
                ((QModelIndex *)&local_68,&(this_00->super_QAbstractItemViewPrivate).root);
      lVar12 = *(long *)pQVar17;
      iVar16 = 0;
LAB_0056bc12:
      (**(code **)(lVar12 + 0x60))(__return_storage_ptr__,pQVar17,iVar16,iVar8,&local_68);
      goto LAB_0056bec3;
    }
    QVar3 = this_00->grid;
    RVar13.m_i = RStack_9c.m_i;
    if (((ulong)QVar3 & 0x8000000080000000) == 0) {
      RVar13.m_i = QVar3.ht.m_i.m_i + local_a8._4_4_ + -1;
      RStack_9c.m_i = RVar13.m_i;
      local_a0.m_i = local_a8._0_4_ + QVar3.wd.m_i.m_i + -1;
    }
  }
  QVar3 = this_00->commonListView->contentsSize;
  local_68 = (QArrayData *)0x0;
  puStack_60 = (undefined1 *)0x0;
  local_58.ptr = (QAbstractItemModel *)0x0;
  RVar19 = QVar3.ht.m_i;
  switch(cursorAction) {
  case MoveUp:
  case MovePrevious:
    do {
      uVar11 = local_a8;
      iVar16 = local_a8._4_4_;
      iVar8 = ~RStack_9c.m_i + local_a8._4_4_ * 2;
      local_a8 = CONCAT44(iVar8,local_a8._0_4_);
      RStack_9c.m_i = iVar16 + -1;
      if (iVar16 + -1 < 1) goto LAB_0056c649;
      if (iVar8 < 0) {
        local_a8 = uVar11 & 0xffffffff;
      }
      if (((this_00->super_QAbstractItemViewPrivate).delayedPendingLayout == true) &&
         ((this_00->super_QAbstractItemViewPrivate).state != CollapsingState)) {
        QAbstractItemViewPrivate::interruptDelayedItemsLayout
                  (&this_00->super_QAbstractItemViewPrivate);
        (**(code **)(**(long **)&(this_00->super_QAbstractItemViewPrivate).
                                 super_QAbstractScrollAreaPrivate.super_QFramePrivate.
                                 super_QWidgetPrivate.field_0x8 + 0x220))();
      }
      LVar10 = QWidget::layoutDirection
                         (*(QWidget **)
                           &(this_00->super_QAbstractItemViewPrivate).
                            super_QAbstractScrollAreaPrivate.super_QFramePrivate.
                            super_QWidgetPrivate.field_0x8);
      auVar23 = QRect::normalized();
      uVar11 = auVar23._0_8_;
      if (LVar10 == RightToLeft) {
        pQVar4 = ((this_00->super_QAbstractItemViewPrivate).super_QAbstractScrollAreaPrivate.
                 viewport)->data;
        iVar16 = ((pQVar4->crect).x2.m_i - (pQVar4->crect).x1.m_i) + 1;
        pQVar18 = this_00->commonListView;
        iVar8 = (pQVar18->contentsSize).wd.m_i;
        if (iVar16 <= iVar8) {
          iVar16 = iVar8;
        }
        uVar15 = ~auVar23._8_4_ + iVar16;
        auVar23._8_8_ =
             (ulong)((auVar23._8_4_ - auVar23._0_4_) + uVar15) | auVar23._8_8_ & 0xffffffff00000000;
        auVar23._0_8_ = (ulong)uVar15 | uVar11 & 0xffffffff00000000;
      }
      else {
        pQVar18 = this_00->commonListView;
      }
      _local_e8 = auVar23;
      (*pQVar18->_vptr_QCommonListViewBase[7])(&local_c8,pQVar18,local_e8);
      pQVar6 = local_68;
      local_58.ptr = local_b8.ptr;
      puStack_60 = puStack_c0;
      local_68 = local_c8;
      local_b8.ptr = (QAbstractItemModel *)0x0;
      local_c8 = (QArrayData *)0x0;
      puStack_c0 = (undefined1 *)0x0;
      if (pQVar6 != (QArrayData *)0x0) {
        LOCK();
        (pQVar6->ref_)._q_value.super___atomic_base<int>._M_i =
             (pQVar6->ref_)._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if ((pQVar6->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(pQVar6,0x18,0x10);
        }
      }
      if (local_c8 != (QArrayData *)0x0) {
        LOCK();
        (local_c8->ref_)._q_value.super___atomic_base<int>._M_i =
             (local_c8->ref_)._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if ((local_c8->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(local_c8,0x18,0x10);
        }
      }
      QListViewPrivate::removeCurrentAndDisabled
                (this_00,(QList<QModelIndex> *)&local_68,(QModelIndex *)&local_88);
    } while (local_58.ptr == (QAbstractItemModel *)0x0);
    break;
  case MoveDown:
  case MoveNext:
    do {
      iVar8 = RStack_9c.m_i + 1;
      iVar16 = iVar8 - local_a8._4_4_;
      local_a8 = CONCAT44(iVar8,local_a8._0_4_);
      RVar13.m_i = iVar16 + RStack_9c.m_i;
      RStack_9c.m_i = RVar13.m_i;
      if (RVar19.m_i <= iVar8) goto LAB_0056c649;
      if (RVar19.m_i < RVar13.m_i) {
        RStack_9c.m_i = RVar19.m_i;
      }
      if (((this_00->super_QAbstractItemViewPrivate).delayedPendingLayout == true) &&
         ((this_00->super_QAbstractItemViewPrivate).state != CollapsingState)) {
        QAbstractItemViewPrivate::interruptDelayedItemsLayout
                  (&this_00->super_QAbstractItemViewPrivate);
        (**(code **)(**(long **)&(this_00->super_QAbstractItemViewPrivate).
                                 super_QAbstractScrollAreaPrivate.super_QFramePrivate.
                                 super_QWidgetPrivate.field_0x8 + 0x220))();
      }
      LVar10 = QWidget::layoutDirection
                         (*(QWidget **)
                           &(this_00->super_QAbstractItemViewPrivate).
                            super_QAbstractScrollAreaPrivate.super_QFramePrivate.
                            super_QWidgetPrivate.field_0x8);
      auVar24 = QRect::normalized();
      uVar11 = auVar24._0_8_;
      if (LVar10 == RightToLeft) {
        pQVar4 = ((this_00->super_QAbstractItemViewPrivate).super_QAbstractScrollAreaPrivate.
                 viewport)->data;
        iVar16 = ((pQVar4->crect).x2.m_i - (pQVar4->crect).x1.m_i) + 1;
        pQVar18 = this_00->commonListView;
        iVar8 = (pQVar18->contentsSize).wd.m_i;
        if (iVar16 <= iVar8) {
          iVar16 = iVar8;
        }
        uVar15 = ~auVar24._8_4_ + iVar16;
        auVar24._8_8_ =
             (ulong)((auVar24._8_4_ - auVar24._0_4_) + uVar15) | auVar24._8_8_ & 0xffffffff00000000;
        auVar24._0_8_ = (ulong)uVar15 | uVar11 & 0xffffffff00000000;
      }
      else {
        pQVar18 = this_00->commonListView;
      }
      _local_e8 = auVar24;
      (*pQVar18->_vptr_QCommonListViewBase[7])(&local_c8,pQVar18,local_e8);
      pQVar6 = local_68;
      local_58.ptr = local_b8.ptr;
      puStack_60 = puStack_c0;
      local_68 = local_c8;
      local_b8.ptr = (QAbstractItemModel *)0x0;
      local_c8 = (QArrayData *)0x0;
      puStack_c0 = (undefined1 *)0x0;
      if (pQVar6 != (QArrayData *)0x0) {
        LOCK();
        (pQVar6->ref_)._q_value.super___atomic_base<int>._M_i =
             (pQVar6->ref_)._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if ((pQVar6->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(pQVar6,0x18,0x10);
        }
      }
      if (local_c8 != (QArrayData *)0x0) {
        LOCK();
        (local_c8->ref_)._q_value.super___atomic_base<int>._M_i =
             (local_c8->ref_)._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if ((local_c8->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(local_c8,0x18,0x10);
        }
      }
      QListViewPrivate::removeCurrentAndDisabled
                (this_00,(QList<QModelIndex> *)&local_68,(QModelIndex *)&local_88);
    } while (local_58.ptr == (QAbstractItemModel *)0x0);
    break;
  case MoveLeft:
    do {
      iVar16 = local_a8._0_4_;
      iVar8 = ~local_a0.m_i + local_a8._0_4_ * 2;
      local_a8 = CONCAT44(local_a8._4_4_,iVar8);
      local_a0.m_i = iVar16 + -1;
      if (iVar16 + -1 < 1) goto LAB_0056c649;
      if (iVar8 < 0) {
        local_a8 = (ulong)(uint)local_a8._4_4_ << 0x20;
      }
      if (((this_00->super_QAbstractItemViewPrivate).delayedPendingLayout == true) &&
         ((this_00->super_QAbstractItemViewPrivate).state != CollapsingState)) {
        QAbstractItemViewPrivate::interruptDelayedItemsLayout
                  (&this_00->super_QAbstractItemViewPrivate);
        (**(code **)(**(long **)&(this_00->super_QAbstractItemViewPrivate).
                                 super_QAbstractScrollAreaPrivate.super_QFramePrivate.
                                 super_QWidgetPrivate.field_0x8 + 0x220))();
      }
      LVar10 = QWidget::layoutDirection
                         (*(QWidget **)
                           &(this_00->super_QAbstractItemViewPrivate).
                            super_QAbstractScrollAreaPrivate.super_QFramePrivate.
                            super_QWidgetPrivate.field_0x8);
      auVar25 = QRect::normalized();
      uVar11 = auVar25._0_8_;
      if (LVar10 == RightToLeft) {
        pQVar4 = ((this_00->super_QAbstractItemViewPrivate).super_QAbstractScrollAreaPrivate.
                 viewport)->data;
        iVar16 = ((pQVar4->crect).x2.m_i - (pQVar4->crect).x1.m_i) + 1;
        pQVar18 = this_00->commonListView;
        iVar8 = (pQVar18->contentsSize).wd.m_i;
        if (iVar16 <= iVar8) {
          iVar16 = iVar8;
        }
        uVar15 = ~auVar25._8_4_ + iVar16;
        auVar25._8_8_ =
             (ulong)((auVar25._8_4_ - auVar25._0_4_) + uVar15) | auVar25._8_8_ & 0xffffffff00000000;
        auVar25._0_8_ = (ulong)uVar15 | uVar11 & 0xffffffff00000000;
      }
      else {
        pQVar18 = this_00->commonListView;
      }
      _local_e8 = auVar25;
      (*pQVar18->_vptr_QCommonListViewBase[7])(&local_c8,pQVar18,local_e8);
      pQVar6 = local_68;
      local_58.ptr = local_b8.ptr;
      puStack_60 = puStack_c0;
      local_68 = local_c8;
      local_b8.ptr = (QAbstractItemModel *)0x0;
      local_c8 = (QArrayData *)0x0;
      puStack_c0 = (undefined1 *)0x0;
      if (pQVar6 != (QArrayData *)0x0) {
        LOCK();
        (pQVar6->ref_)._q_value.super___atomic_base<int>._M_i =
             (pQVar6->ref_)._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if ((pQVar6->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(pQVar6,0x18,0x10);
        }
      }
      if (local_c8 != (QArrayData *)0x0) {
        LOCK();
        (local_c8->ref_)._q_value.super___atomic_base<int>._M_i =
             (local_c8->ref_)._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if ((local_c8->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(local_c8,0x18,0x10);
        }
      }
      QListViewPrivate::removeCurrentAndDisabled
                (this_00,(QList<QModelIndex> *)&local_68,(QModelIndex *)&local_88);
    } while (local_58.ptr == (QAbstractItemModel *)0x0);
    break;
  case MoveRight:
    do {
      iVar8 = local_a0.m_i + 1;
      iVar16 = iVar8 - local_a8._0_4_;
      local_a8 = CONCAT44(local_a8._4_4_,iVar8);
      RVar13.m_i = iVar16 + local_a0.m_i;
      local_a0.m_i = RVar13.m_i;
      RVar19 = QVar3.wd.m_i;
      if (RVar19.m_i <= iVar8) goto LAB_0056c649;
      if (RVar19.m_i < RVar13.m_i) {
        local_a0.m_i = RVar19.m_i;
      }
      if (((this_00->super_QAbstractItemViewPrivate).delayedPendingLayout == true) &&
         ((this_00->super_QAbstractItemViewPrivate).state != CollapsingState)) {
        QAbstractItemViewPrivate::interruptDelayedItemsLayout
                  (&this_00->super_QAbstractItemViewPrivate);
        (**(code **)(**(long **)&(this_00->super_QAbstractItemViewPrivate).
                                 super_QAbstractScrollAreaPrivate.super_QFramePrivate.
                                 super_QWidgetPrivate.field_0x8 + 0x220))();
      }
      LVar10 = QWidget::layoutDirection
                         (*(QWidget **)
                           &(this_00->super_QAbstractItemViewPrivate).
                            super_QAbstractScrollAreaPrivate.super_QFramePrivate.
                            super_QWidgetPrivate.field_0x8);
      auVar28 = QRect::normalized();
      uVar11 = auVar28._0_8_;
      if (LVar10 == RightToLeft) {
        pQVar4 = ((this_00->super_QAbstractItemViewPrivate).super_QAbstractScrollAreaPrivate.
                 viewport)->data;
        iVar16 = ((pQVar4->crect).x2.m_i - (pQVar4->crect).x1.m_i) + 1;
        pQVar18 = this_00->commonListView;
        iVar8 = (pQVar18->contentsSize).wd.m_i;
        if (iVar16 <= iVar8) {
          iVar16 = iVar8;
        }
        uVar15 = ~auVar28._8_4_ + iVar16;
        auVar28._8_8_ =
             (ulong)((auVar28._8_4_ - auVar28._0_4_) + uVar15) | auVar28._8_8_ & 0xffffffff00000000;
        auVar28._0_8_ = (ulong)uVar15 | uVar11 & 0xffffffff00000000;
      }
      else {
        pQVar18 = this_00->commonListView;
      }
      _local_e8 = auVar28;
      (*pQVar18->_vptr_QCommonListViewBase[7])(&local_c8,pQVar18,local_e8);
      pQVar6 = local_68;
      local_58.ptr = local_b8.ptr;
      puStack_60 = puStack_c0;
      local_68 = local_c8;
      local_b8.ptr = (QAbstractItemModel *)0x0;
      local_c8 = (QArrayData *)0x0;
      puStack_c0 = (undefined1 *)0x0;
      if (pQVar6 != (QArrayData *)0x0) {
        LOCK();
        (pQVar6->ref_)._q_value.super___atomic_base<int>._M_i =
             (pQVar6->ref_)._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if ((pQVar6->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(pQVar6,0x18,0x10);
        }
      }
      if (local_c8 != (QArrayData *)0x0) {
        LOCK();
        (local_c8->ref_)._q_value.super___atomic_base<int>._M_i =
             (local_c8->ref_)._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if ((local_c8->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(local_c8,0x18,0x10);
        }
      }
      QListViewPrivate::removeCurrentAndDisabled
                (this_00,(QList<QModelIndex> *)&local_68,(QModelIndex *)&local_88);
    } while (local_58.ptr == (QAbstractItemModel *)0x0);
    break;
  case MoveHome:
    pQVar17 = (this_00->super_QAbstractItemViewPrivate).model;
    iVar8 = this_00->column;
    QPersistentModelIndex::operator_cast_to_QModelIndex
              ((QModelIndex *)&local_c8,&(this_00->super_QAbstractItemViewPrivate).root);
    lVar12 = *(long *)pQVar17;
    iVar16 = 0;
    goto LAB_0056c694;
  case MoveEnd:
    pQVar17 = (this_00->super_QAbstractItemViewPrivate).model;
    iVar16 = this_00->commonListView->batchStartRow + -1;
    iVar8 = this_00->column;
    QPersistentModelIndex::operator_cast_to_QModelIndex
              ((QModelIndex *)&local_c8,&(this_00->super_QAbstractItemViewPrivate).root);
    lVar12 = *(long *)pQVar17;
LAB_0056c694:
    (**(code **)(lVar12 + 0x60))(__return_storage_ptr__,pQVar17,iVar16,iVar8,&local_c8);
    goto LAB_0056c92b;
  case MovePageUp:
    pQVar4 = ((this_00->super_QAbstractItemViewPrivate).super_QAbstractScrollAreaPrivate.viewport)->
             data;
    iVar8 = ((pQVar4->crect).y2.m_i - (pQVar4->crect).y1.m_i) + 1;
    if ((RVar13.m_i - local_a8._4_4_) + 1 < iVar8) {
      iVar9 = local_a8._4_4_ - iVar8;
      iVar16 = iVar9 + 1;
      RStack_9c.m_i = (RVar13.m_i - iVar8) + 1;
      local_a8 = CONCAT44(iVar16,local_a8._0_4_);
      if (iVar16 < RStack_9c.m_i - iVar9) {
        local_a8 = local_98._0_8_ & 0xffffffff;
        RStack_9c.m_i = 1;
      }
      index = (QModelIndex *)&local_c8;
      local_b8.ptr = local_78.ptr;
      local_c8 = local_88;
      puStack_c0 = (undefined1 *)uStack_80;
      while( true ) {
        if (local_58.ptr == (QAbstractItemModel *)0x0) {
        }
        else {
          QVar22 = QListViewPrivate::rectForIndex
                             (*(QListViewPrivate **)
                               &(this->super_QAbstractItemView).super_QAbstractScrollArea.
                                super_QFrame.super_QWidget.field_0x8,index);
          QVar26 = QListViewPrivate::rectForIndex
                             (*(QListViewPrivate **)
                               &(this->super_QAbstractItemView).super_QAbstractScrollArea.
                                super_QFrame.super_QWidget.field_0x8,(QModelIndex *)&local_88);
          pQVar4 = ((this_00->super_QAbstractItemViewPrivate).super_QAbstractScrollAreaPrivate.
                   viewport)->data;
          if (0 < local_a8._4_4_ &&
              ~(pQVar4->crect).y2.m_i + QVar26.y2.m_i.m_i + (pQVar4->crect).y1.m_i <
              QVar22.y1.m_i.m_i) goto LAB_0056c91a;
        }
        local_a8 = CONCAT44(local_a8._4_4_ + 1,local_a8._0_4_);
        RVar13.m_i = RStack_9c.m_i;
        RStack_9c.m_i = RStack_9c.m_i + 1;
        if (0x7ffffffe < (uint)RVar13.m_i) break;
        if (((this_00->super_QAbstractItemViewPrivate).delayedPendingLayout == true) &&
           ((this_00->super_QAbstractItemViewPrivate).state != CollapsingState)) {
          QAbstractItemViewPrivate::interruptDelayedItemsLayout
                    (&this_00->super_QAbstractItemViewPrivate);
          (**(code **)(**(long **)&(this_00->super_QAbstractItemViewPrivate).
                                   super_QAbstractScrollAreaPrivate.super_QFramePrivate.
                                   super_QWidgetPrivate.field_0x8 + 0x220))();
        }
        LVar10 = QWidget::layoutDirection
                           (*(QWidget **)
                             &(this_00->super_QAbstractItemViewPrivate).
                              super_QAbstractScrollAreaPrivate.super_QFramePrivate.
                              super_QWidgetPrivate.field_0x8);
        auVar29 = QRect::normalized();
        uVar11 = auVar29._0_8_;
        if (LVar10 == RightToLeft) {
          pQVar4 = ((this_00->super_QAbstractItemViewPrivate).super_QAbstractScrollAreaPrivate.
                   viewport)->data;
          iVar16 = ((pQVar4->crect).x2.m_i - (pQVar4->crect).x1.m_i) + 1;
          pQVar18 = this_00->commonListView;
          iVar8 = (pQVar18->contentsSize).wd.m_i;
          if (iVar16 <= iVar8) {
            iVar16 = iVar8;
          }
          uVar15 = ~auVar29._8_4_ + iVar16;
          auVar29._8_8_ =
               (ulong)((auVar29._8_4_ - auVar29._0_4_) + uVar15) |
               auVar29._8_8_ & 0xffffffff00000000;
          auVar29._0_8_ = (ulong)uVar15 | uVar11 & 0xffffffff00000000;
        }
        else {
          pQVar18 = this_00->commonListView;
        }
        local_48 = auVar29;
        (*pQVar18->_vptr_QCommonListViewBase[7])((QModelIndex *)local_e8,pQVar18,local_48);
        pQVar6 = local_68;
        local_58.ptr = local_d8.ptr;
        puStack_60 = puStack_e0;
        local_68 = (QArrayData *)local_e8;
        local_d8.ptr = (QAbstractItemModel *)0x0;
        local_e8 = (undefined1  [8])0x0;
        puStack_e0 = (undefined1 *)0x0;
        if (pQVar6 != (QArrayData *)0x0) {
          LOCK();
          (pQVar6->ref_)._q_value.super___atomic_base<int>._M_i =
               (pQVar6->ref_)._q_value.super___atomic_base<int>._M_i + -1;
          UNLOCK();
          if ((pQVar6->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
            QArrayData::deallocate(pQVar6,0x18,0x10);
          }
        }
        if (local_e8 != (undefined1  [8])0x0) {
          LOCK();
          (((QBasicAtomicInt *)local_e8)->_q_value).super___atomic_base<int>._M_i =
               (((QBasicAtomicInt *)local_e8)->_q_value).super___atomic_base<int>._M_i + -1;
          UNLOCK();
          if ((((QBasicAtomicInt *)local_e8)->_q_value).super___atomic_base<int>._M_i == 0) {
            QArrayData::deallocate((QArrayData *)local_e8,0x18,0x10);
          }
        }
        QListViewPrivate::closestIndex
                  ((QModelIndex *)local_e8,this_00,&local_98,(QList<QModelIndex> *)&local_68);
        local_b8.ptr = local_d8.ptr;
        local_c8 = (QArrayData *)local_e8;
        puStack_c0 = puStack_e0;
      }
      index = (QModelIndex *)&local_88;
LAB_0056c91a:
      (__return_storage_ptr__->m).ptr = (index->m).ptr;
      iVar8 = index->r;
      iVar16 = index->c;
      uVar20 = (undefined4)index->i;
      uVar21 = *(undefined4 *)((long)&index->i + 4);
      goto LAB_0056c928;
    }
    lVar12 = *(long *)&(this->super_QAbstractItemView).super_QAbstractScrollArea.super_QFrame.
                       super_QWidget;
    uVar14 = 0;
    goto LAB_0056c904;
  case MovePageDown:
    pQVar4 = ((this_00->super_QAbstractItemViewPrivate).super_QAbstractScrollAreaPrivate.viewport)->
             data;
    iVar8 = ((pQVar4->crect).y2.m_i - (pQVar4->crect).y1.m_i) + 1;
    if ((RVar13.m_i - local_a8._4_4_) + 1 < iVar8) {
      RStack_9c.m_i = RVar13.m_i + iVar8 + -1;
      RVar5.m_i = local_a8._4_4_ + iVar8;
      if ((RVar19.m_i + local_a8._4_4_ + -1) - RVar13.m_i < RStack_9c.m_i) {
        RStack_9c.m_i = RVar19.m_i;
        RVar5.m_i = RVar19.m_i;
      }
      local_a8 = CONCAT44(RVar5.m_i + -1,local_a8._0_4_);
      local_b8.ptr = local_78.ptr;
      local_c8 = local_88;
      puStack_c0 = (undefined1 *)uStack_80;
      do {
        if (local_58.ptr == (QAbstractItemModel *)0x0) {
        }
        else {
          QVar22 = QListViewPrivate::rectForIndex
                             (*(QListViewPrivate **)
                               &(this->super_QAbstractItemView).super_QAbstractScrollArea.
                                super_QFrame.super_QWidget.field_0x8,(QModelIndex *)&local_c8);
          pQVar4 = ((this_00->super_QAbstractItemViewPrivate).super_QAbstractScrollAreaPrivate.
                   viewport)->data;
          iVar8 = (pQVar4->crect).y2.m_i;
          iVar16 = (pQVar4->crect).y1.m_i;
          QVar26 = QListViewPrivate::rectForIndex
                             (*(QListViewPrivate **)
                               &(this->super_QAbstractItemView).super_QAbstractScrollArea.
                                super_QFrame.super_QWidget.field_0x8,index);
          if ((QVar22.y2.m_i.m_i < (iVar8 - iVar16) + QVar26.y1.m_i.m_i + 1) &&
             (RStack_9c.m_i <= RVar19.m_i)) {
            index = (QModelIndex *)&local_c8;
            goto LAB_0056c91a;
          }
        }
        iVar8 = local_a8._4_4_ + -1;
        local_a8 = CONCAT44(iVar8,local_a8._0_4_);
        RStack_9c.m_i = RStack_9c.m_i + -1;
        if (RVar19.m_i <= iVar8) goto LAB_0056c91a;
        if (((this_00->super_QAbstractItemViewPrivate).delayedPendingLayout == true) &&
           ((this_00->super_QAbstractItemViewPrivate).state != CollapsingState)) {
          QAbstractItemViewPrivate::interruptDelayedItemsLayout
                    (&this_00->super_QAbstractItemViewPrivate);
          (**(code **)(**(long **)&(this_00->super_QAbstractItemViewPrivate).
                                   super_QAbstractScrollAreaPrivate.super_QFramePrivate.
                                   super_QWidgetPrivate.field_0x8 + 0x220))();
        }
        LVar10 = QWidget::layoutDirection
                           (*(QWidget **)
                             &(this_00->super_QAbstractItemViewPrivate).
                              super_QAbstractScrollAreaPrivate.super_QFramePrivate.
                              super_QWidgetPrivate.field_0x8);
        auVar27 = QRect::normalized();
        uVar11 = auVar27._0_8_;
        if (LVar10 == RightToLeft) {
          pQVar4 = ((this_00->super_QAbstractItemViewPrivate).super_QAbstractScrollAreaPrivate.
                   viewport)->data;
          iVar16 = ((pQVar4->crect).x2.m_i - (pQVar4->crect).x1.m_i) + 1;
          pQVar18 = this_00->commonListView;
          iVar8 = (pQVar18->contentsSize).wd.m_i;
          if (iVar16 <= iVar8) {
            iVar16 = iVar8;
          }
          uVar15 = ~auVar27._8_4_ + iVar16;
          auVar27._8_8_ =
               (ulong)((auVar27._8_4_ - auVar27._0_4_) + uVar15) |
               auVar27._8_8_ & 0xffffffff00000000;
          auVar27._0_8_ = (ulong)uVar15 | uVar11 & 0xffffffff00000000;
        }
        else {
          pQVar18 = this_00->commonListView;
        }
        local_48 = auVar27;
        (*pQVar18->_vptr_QCommonListViewBase[7])((QModelIndex *)local_e8,pQVar18,local_48);
        pQVar6 = local_68;
        local_58.ptr = local_d8.ptr;
        puStack_60 = puStack_e0;
        local_68 = (QArrayData *)local_e8;
        local_d8.ptr = (QAbstractItemModel *)0x0;
        local_e8 = (undefined1  [8])0x0;
        puStack_e0 = (undefined1 *)0x0;
        if (pQVar6 != (QArrayData *)0x0) {
          LOCK();
          (pQVar6->ref_)._q_value.super___atomic_base<int>._M_i =
               (pQVar6->ref_)._q_value.super___atomic_base<int>._M_i + -1;
          UNLOCK();
          if ((pQVar6->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
            QArrayData::deallocate(pQVar6,0x18,0x10);
          }
        }
        if (local_e8 != (undefined1  [8])0x0) {
          LOCK();
          (((QBasicAtomicInt *)local_e8)->_q_value).super___atomic_base<int>._M_i =
               (((QBasicAtomicInt *)local_e8)->_q_value).super___atomic_base<int>._M_i + -1;
          UNLOCK();
          if ((((QBasicAtomicInt *)local_e8)->_q_value).super___atomic_base<int>._M_i == 0) {
            QArrayData::deallocate((QArrayData *)local_e8,0x18,0x10);
          }
        }
        QListViewPrivate::closestIndex
                  ((QModelIndex *)local_e8,this_00,&local_98,(QList<QModelIndex> *)&local_68);
        local_b8.ptr = local_d8.ptr;
        local_c8 = (QArrayData *)local_e8;
        puStack_c0 = puStack_e0;
      } while( true );
    }
    lVar12 = *(long *)&(this->super_QAbstractItemView).super_QAbstractScrollArea.super_QFrame.
                       super_QWidget;
    uVar14 = 1;
LAB_0056c904:
    (**(code **)(lVar12 + 0x2a8))
              (__return_storage_ptr__,this,uVar14,
               modifiers.super_QFlagsStorageHelper<Qt::KeyboardModifier,_4>.
               super_QFlagsStorage<Qt::KeyboardModifier>.i);
    goto LAB_0056c92b;
  default:
    goto switchD_0056bd27_default;
  }
  QListViewPrivate::closestIndex
            (__return_storage_ptr__,this_00,&local_98,(QList<QModelIndex> *)&local_68);
LAB_0056c92b:
  if (local_68 != (QArrayData *)0x0) {
    LOCK();
    (local_68->ref_)._q_value.super___atomic_base<int>._M_i =
         (local_68->ref_)._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((local_68->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(local_68,0x18,0x10);
    }
  }
LAB_0056bec3:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
LAB_0056c649:
  (__return_storage_ptr__->m).ptr = local_78.ptr;
  iVar8 = (int)local_88;
  iVar16 = local_88._4_4_;
  uVar20 = (undefined4)uStack_80;
  uVar21 = uStack_80._4_4_;
LAB_0056c928:
  __return_storage_ptr__->r = iVar8;
  __return_storage_ptr__->c = iVar16;
  *(undefined4 *)&__return_storage_ptr__->i = uVar20;
  *(undefined4 *)((long)&__return_storage_ptr__->i + 4) = uVar21;
  goto LAB_0056c92b;
}

Assistant:

QModelIndex QListView::moveCursor(CursorAction cursorAction, Qt::KeyboardModifiers modifiers)
{
    Q_D(QListView);
    Q_UNUSED(modifiers);

    auto findAvailableRowBackward = [d](int row) {
        while (row >= 0 && d->isHiddenOrDisabled(row))
            --row;
        return row;
    };

    auto findAvailableRowForward = [d](int row) {
        int rowCount = d->model->rowCount(d->root);
        if (!rowCount)
            return -1;
        while (row < rowCount && d->isHiddenOrDisabled(row))
            ++row;
        if (row >= rowCount)
            return -1;
        return row;
    };

    QModelIndex current = currentIndex();
    if (!current.isValid()) {
        int row = findAvailableRowForward(0);
        if (row == -1)
            return QModelIndex();
        return d->model->index(row, d->column, d->root);
    }

    if ((d->flow == LeftToRight && cursorAction == MoveLeft) ||
            (d->flow == TopToBottom && (cursorAction == MoveUp || cursorAction == MovePrevious))) {
        const int row = findAvailableRowBackward(current.row() - 1);
        if (row == -1)
            return current;
        return d->model->index(row, d->column, d->root);
    } else if ((d->flow == LeftToRight && cursorAction == MoveRight) ||
               (d->flow == TopToBottom && (cursorAction == MoveDown || cursorAction == MoveNext))) {
        const int row = findAvailableRowForward(current.row() + 1);
        if (row == -1)
            return current;
        return d->model->index(row, d->column, d->root);
    }

    const QRect initialRect = rectForIndex(current);
    QRect rect = initialRect;
    if (rect.isEmpty()) {
        return d->model->index(0, d->column, d->root);
    }
    if (d->gridSize().isValid()) rect.setSize(d->gridSize());

    QSize contents = d->contentsSize();
    QList<QModelIndex> intersectVector;

    switch (cursorAction) {
    case MoveLeft:
        while (intersectVector.isEmpty()) {
            rect.translate(-rect.width(), 0);
            if (rect.right() <= 0)
                return current;
            if (rect.left() < 0)
                rect.setLeft(0);
            intersectVector = d->intersectingSet(rect);
            d->removeCurrentAndDisabled(&intersectVector, current);
        }
        return d->closestIndex(initialRect, intersectVector);
    case MoveRight:
        while (intersectVector.isEmpty()) {
            rect.translate(rect.width(), 0);
            if (rect.left() >= contents.width())
                return current;
            if (rect.right() > contents.width())
                rect.setRight(contents.width());
            intersectVector = d->intersectingSet(rect);
            d->removeCurrentAndDisabled(&intersectVector, current);
        }
        return d->closestIndex(initialRect, intersectVector);
    case MovePageUp: {
        if (rect.height() >= d->viewport->height())
           return moveCursor(QAbstractItemView::MoveUp, modifiers);

        rect.moveTop(rect.top() - d->viewport->height() + 1);
        if (rect.top() < rect.height()) {
            rect.setTop(0);
            rect.setBottom(1);
        }
        QModelIndex findindex = current;
        while (intersectVector.isEmpty()
               || rectForIndex(findindex).top() <= (rectForIndex(current).bottom() - d->viewport->rect().height())
               || rect.top() <= 0) {
            rect.translate(0, 1);
            if (rect.bottom() <= 0) {
                return current;
            }
            intersectVector = d->intersectingSet(rect);
            findindex = d->closestIndex(initialRect, intersectVector);
        }
        return findindex;
    }
    case MovePrevious:
    case MoveUp:
        while (intersectVector.isEmpty()) {
            rect.translate(0, -rect.height());
            if (rect.bottom() <= 0) {
#ifdef QT_KEYPAD_NAVIGATION
                if (QApplicationPrivate::keypadNavigationEnabled()) {
                    int row = d->batchStartRow() - 1;
                    while (row >= 0 && d->isHiddenOrDisabled(row))
                        --row;
                    if (row >= 0)
                        return d->model->index(row, d->column, d->root);
                }
#endif
                return current;
            }
            if (rect.top() < 0)
                rect.setTop(0);
            intersectVector = d->intersectingSet(rect);
            d->removeCurrentAndDisabled(&intersectVector, current);
        }
        return d->closestIndex(initialRect, intersectVector);
    case MovePageDown: {
        if (rect.height() >= d->viewport->height())
           return moveCursor(QAbstractItemView::MoveDown, modifiers);

        rect.moveTop(rect.top() + d->viewport->height() - 1);
        if (rect.bottom() > contents.height() - rect.height()) {
            rect.setTop(contents.height() - 1);
            rect.setBottom(contents.height());
        }
        QModelIndex index = current;
        // index's bottom() - current's top() always <=  (d->viewport->rect().height()
        while (intersectVector.isEmpty()
               || rectForIndex(index).bottom() >= (d->viewport->rect().height() + rectForIndex(current).top())
               || rect.bottom() > contents.height()) {
            rect.translate(0, -1);
            if (rect.top() >= contents.height()) {
                return current;
            }
            intersectVector = d->intersectingSet(rect);
            index = d->closestIndex(initialRect, intersectVector);
        }
        return index;
    }
    case MoveNext:
    case MoveDown:
        while (intersectVector.isEmpty()) {
            rect.translate(0, rect.height());
            if (rect.top() >= contents.height()) {
#ifdef QT_KEYPAD_NAVIGATION
                if (QApplicationPrivate::keypadNavigationEnabled()) {
                    int rowCount = d->model->rowCount(d->root);
                    int row = 0;
                    while (row < rowCount && d->isHiddenOrDisabled(row))
                        ++row;
                    if (row < rowCount)
                        return d->model->index(row, d->column, d->root);
                }
#endif
                return current;
            }
            if (rect.bottom() > contents.height())
                rect.setBottom(contents.height());
            intersectVector = d->intersectingSet(rect);
            d->removeCurrentAndDisabled(&intersectVector, current);
        }
        return d->closestIndex(initialRect, intersectVector);
    case MoveHome:
        return d->model->index(0, d->column, d->root);
    case MoveEnd:
        return d->model->index(d->batchStartRow() - 1, d->column, d->root);}

    return current;
}